

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_read_uint32(void *a,uint32_t **attrib,trico_stream_type st)

{
  long lVar1;
  int iVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  uint8_t *b1;
  uint8_t *b2;
  uint8_t *b3;
  uint8_t *b4;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint unaff_R13D;
  uint local_58;
  uint local_54;
  
  iVar7 = 0;
  iVar8 = 0;
  if (*(trico_stream_type *)((long)a + 0x24) == st) {
    iVar2 = *(int *)((long)a + 0x40);
    bVar4 = true;
    if ((iVar2 == 0) &&
       (puVar3 = *(uint **)((long)a + 0x18),
       (ulong)((long)puVar3 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
      local_54 = *puVar3;
      *(uint **)((long)a + 0x18) = puVar3 + 1;
      bVar4 = false;
    }
    iVar8 = iVar7;
    if (!bVar4) {
      bVar4 = true;
      local_58 = unaff_R13D;
      if ((iVar2 == 0) &&
         (puVar3 = *(uint **)((long)a + 0x18),
         (ulong)((long)puVar3 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
        local_58 = *puVar3;
        *(uint **)((long)a + 0x18) = puVar3 + 1;
        bVar4 = false;
      }
      if (!bVar4) {
        uVar10 = (ulong)local_58;
        pcVar6 = (char *)malloc(uVar10);
        if (iVar2 == 0) {
          lVar1 = (long)*(void **)((long)a + 0x18) + uVar10;
          if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
            memcpy(pcVar6,*(void **)((long)a + 0x18),uVar10);
            *(long *)((long)a + 0x18) = lVar1;
            uVar10 = (ulong)local_54;
            b1 = (uint8_t *)malloc(uVar10);
            uVar5 = LZ4_decompress_safe(pcVar6,(char *)b1,local_58,local_54);
            if (uVar5 != local_54) {
              __assert_fail("bytes_decompressed == nr_of_attribs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                            ,0x5e6,
                            "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)");
            }
            iVar7 = *(int *)((long)a + 0x40);
            bVar4 = true;
            if ((iVar7 == 0) &&
               (puVar3 = *(uint **)((long)a + 0x18),
               (ulong)((long)puVar3 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30)
               )) {
              local_58 = *puVar3;
              *(uint **)((long)a + 0x18) = puVar3 + 1;
              bVar4 = false;
            }
            if (!bVar4) {
              uVar9 = (ulong)local_58;
              pcVar6 = (char *)realloc(pcVar6,uVar9);
              if (iVar7 == 0) {
                lVar1 = (long)*(void **)((long)a + 0x18) + uVar9;
                if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
                  memcpy(pcVar6,*(void **)((long)a + 0x18),uVar9);
                  *(long *)((long)a + 0x18) = lVar1;
                  b2 = (uint8_t *)malloc(uVar10);
                  uVar5 = LZ4_decompress_safe(pcVar6,(char *)b2,local_58,local_54);
                  if (uVar5 != local_54) {
                    __assert_fail("bytes_decompressed == nr_of_attribs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x5ef,
                                  "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)"
                                 );
                  }
                  iVar7 = *(int *)((long)a + 0x40);
                  bVar4 = true;
                  if ((iVar7 == 0) &&
                     (puVar3 = *(uint **)((long)a + 0x18),
                     (ulong)((long)puVar3 + (4 - *(long *)((long)a + 0x10))) <=
                     *(ulong *)((long)a + 0x30))) {
                    local_58 = *puVar3;
                    *(uint **)((long)a + 0x18) = puVar3 + 1;
                    bVar4 = false;
                  }
                  if (!bVar4) {
                    uVar9 = (ulong)local_58;
                    pcVar6 = (char *)realloc(pcVar6,uVar9);
                    if (iVar7 == 0) {
                      lVar1 = (long)*(void **)((long)a + 0x18) + uVar9;
                      if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30))
                      {
                        memcpy(pcVar6,*(void **)((long)a + 0x18),uVar9);
                        *(long *)((long)a + 0x18) = lVar1;
                        b3 = (uint8_t *)malloc(uVar10);
                        uVar5 = LZ4_decompress_safe(pcVar6,(char *)b3,local_58,local_54);
                        if (uVar5 != local_54) {
                          __assert_fail("bytes_decompressed == nr_of_attribs",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                        ,0x5f8,
                                        "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)"
                                       );
                        }
                        iVar7 = *(int *)((long)a + 0x40);
                        bVar4 = true;
                        if ((iVar7 == 0) &&
                           (puVar3 = *(uint **)((long)a + 0x18),
                           (ulong)((long)puVar3 + (4 - *(long *)((long)a + 0x10))) <=
                           *(ulong *)((long)a + 0x30))) {
                          local_58 = *puVar3;
                          *(uint **)((long)a + 0x18) = puVar3 + 1;
                          bVar4 = false;
                        }
                        if (!bVar4) {
                          uVar9 = (ulong)local_58;
                          pcVar6 = (char *)realloc(pcVar6,uVar9);
                          if (iVar7 == 0) {
                            lVar1 = (long)*(void **)((long)a + 0x18) + uVar9;
                            if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <=
                                *(ulong *)((long)a + 0x30)) {
                              memcpy(pcVar6,*(void **)((long)a + 0x18),uVar9);
                              *(long *)((long)a + 0x18) = lVar1;
                              b4 = (uint8_t *)malloc(uVar10);
                              uVar5 = LZ4_decompress_safe(pcVar6,(char *)b4,local_58,local_54);
                              if (uVar5 != local_54) {
                                __assert_fail("bytes_decompressed == nr_of_attribs",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                              ,0x601,
                                              "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)"
                                             );
                              }
                              if (attrib != (uint32_t **)0x0) {
                                trico_transpose_uint32_soa_to_aos(attrib,b1,b2,b3,b4,local_54);
                              }
                              free(pcVar6);
                              free(b1);
                              free(b2);
                              free(b3);
                              free(b4);
                              read_next_stream_type((trico_archive *)a);
                              iVar8 = 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

static int trico_read_uint32(void* a, uint32_t** attrib, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (attrib != NULL)
    trico_transpose_uint32_soa_to_aos(attrib, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, nr_of_attribs);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);

  read_next_stream_type(arch);

  return 1;
  }